

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"performance float",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  benchmark<float>(8,0x20,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"performance double",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  benchmark<double>(8,0x20,0x10);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::cout<<"performance float"<<std::endl;
	benchmark<float>(8,32,16);
	std::cout<<"performance double"<<std::endl;
	benchmark<double>(8,32,16);
}